

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# new.cc
# Opt level: O1

void * operator_new(size_t size,align_val_t val)

{
  Iter<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *fl;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *alloc;
  ulong uVar1;
  Alloc<void> AVar2;
  int *piVar3;
  sizeclass_t sizeclass;
  CapPtr<void,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)1,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
  CVar4;
  ulong uVar5;
  ulong uVar6;
  Node *pNVar7;
  size_t size_00;
  long *in_FS_OFFSET;
  Pair<capptr::Chunk<void>,_SlabMetadata_*> PVar8;
  undefined8 uStack_10;
  ulong uVar9;
  
  uVar5 = size - 1 | val - 1;
  uVar9 = uVar5 + 1;
  if (((0xdfff < uVar5) && (uVar9 == 0)) && (size != 0)) {
    uVar9 = 0xffffffffffffffff;
  }
  alloc = (Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *)
          *in_FS_OFFSET;
  if (uVar9 - 1 < 0xe000) {
    fl = (alloc->super_FastFreeLists).small_fast_free_lists +
         (byte)(&snmalloc::sizeclass_lookup)[uVar9 - 1 >> 4];
    if ((fl->curr).unsafe_capptr ==
        (T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
         *)0x0) {
      if ((alloc->remote_alloc).list.front.unsafe_capptr._M_b._M_p ==
          (alloc->remote_alloc).list.back.unsafe_capptr._M_b._M_p) {
        uStack_10 = 0x104cac;
        AVar2 = snmalloc::
                Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>::
                small_alloc<(snmalloc::ZeroMem)0,_snmalloc::CheckInitPthread>::
                anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)&stack0xffffffffffffffff,alloc,
                           (ulong)(byte)(&snmalloc::sizeclass_lookup)[uVar9 - 1 >> 4],fl);
      }
      else {
        uStack_10 = 0x104cc0;
        AVar2 = snmalloc::
                Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>::
                handle_message_queue_slow<snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>::small_alloc<(snmalloc::ZeroMem)0,snmalloc::CheckInitPthread>(unsigned_long)::_lambda(snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>*,unsigned_long,snmalloc::freelist::Iter<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)1>,snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)0>>*)_1_,snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>*,unsigned_long,snmalloc::freelist::Iter<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)1>,snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)0>>*>
                          ((Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>
                            *)alloc);
      }
    }
    else {
      AVar2.unsafe_capptr = (fl->curr).unsafe_capptr;
      (fl->curr).unsafe_capptr =
           (T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
            *)((T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
                *)AVar2.unsafe_capptr)->field_0;
    }
    return AVar2.unsafe_capptr;
  }
  if (uVar9 == 0) {
    if ((alloc->super_FastFreeLists).small_fast_free_lists[0].curr.unsafe_capptr ==
        (T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
         *)0x0) {
      if ((alloc->remote_alloc).list.front.unsafe_capptr._M_b._M_p ==
          (alloc->remote_alloc).list.back.unsafe_capptr._M_b._M_p) {
        CVar4.unsafe_capptr =
             (void *)snmalloc::
                     Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
                     ::small_alloc<(snmalloc::ZeroMem)0,_snmalloc::CheckInitPthread>::
                     anon_class_1_0_00000001::operator()
                               ((anon_class_1_0_00000001 *)((long)&uStack_10 + 7),alloc,0,
                                (Iter<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
                                 *)alloc);
      }
      else {
        CVar4.unsafe_capptr =
             (void *)snmalloc::
                     Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>
                     ::
                     handle_message_queue_slow<snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>::small_alloc<(snmalloc::ZeroMem)0,snmalloc::CheckInitPthread>(unsigned_long)::_lambda(snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>*,unsigned_long,snmalloc::freelist::Iter<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)1>,snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)0>>*)_1_,snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>*,unsigned_long,snmalloc::freelist::Iter<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)1>,snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)0>>*>
                               ((Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>
                                 *)alloc,alloc,0,alloc);
      }
    }
    else {
      CVar4.unsafe_capptr = (alloc->super_FastFreeLists).small_fast_free_lists[0].curr.unsafe_capptr
      ;
      (alloc->super_FastFreeLists).small_fast_free_lists[0].curr.unsafe_capptr =
           (T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
            *)*(anon_union_8_2_ba34fa37_for_T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>_1
                *)&((Node *)CVar4.unsafe_capptr)->next;
    }
  }
  else {
    if ((alloc->remote_alloc).list.front.unsafe_capptr._M_b._M_p !=
        (alloc->remote_alloc).list.back.unsafe_capptr._M_b._M_p) {
      AVar2 = snmalloc::
              Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>::
              handle_message_queue_slow<snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>::alloc_not_small<(snmalloc::ZeroMem)0,snmalloc::CheckInitPthread>(unsigned_long,snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>*)::_lambda(snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>*,unsigned_long)_1_,snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>*,unsigned_long>
                        ((Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>
                          *)alloc,alloc,uVar9);
      return AVar2.unsafe_capptr;
    }
    if ((Alloc *)*in_FS_OFFSET == &snmalloc::ThreadAlloc::default_alloc) {
      AVar2 = snmalloc::ThreadAlloc::CheckInitBase<snmalloc::CheckInitPthread>::operator()(uVar9);
      return AVar2.unsafe_capptr;
    }
    if (uVar9 < 0x8000000000000001) {
      uVar5 = uVar9 - 1;
      uVar1 = 0x3f;
      if (uVar5 != 0) {
        for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      size_00 = 1L << (-((byte)uVar1 ^ 0x3f) & 0x3f);
      if (uVar9 < 3) {
        size_00 = uVar9;
      }
      if (uVar9 < 0xe001) {
        uVar6 = (ulong)(byte)(&snmalloc::sizeclass_lookup)[uVar5 >> 4] + 0x40;
      }
      else {
        uVar6 = uVar1 ^ 0x3f;
      }
      if (uVar9 < 0xe001) {
        sizeclass.value = (ulong)(byte)(&snmalloc::sizeclass_lookup)[uVar5 >> 4] + 0x40;
      }
      else {
        sizeclass.value = uVar1 ^ 0x3f;
      }
      PVar8 = snmalloc::
              BackendAllocator<snmalloc::PALLinux,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>,_snmalloc::DummyAuthmap,_snmalloc::StandardLocalState<snmalloc::PALLinux,_snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>,_snmalloc::PagemapRegisterRange<snmalloc::DummyAuthmap>::Type<snmalloc::PagemapRegisterRange<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>::Type<snmalloc::PalRange<snmalloc::PALLinux>_>_>,_14UL>_>
              ::alloc_chunk(&alloc->backend_state,size_00,
                            (long)&(alloc->remote_alloc).list.back.unsafe_capptr._M_b._M_p + uVar6,
                            sizeclass);
      pNVar7 = (Node *)PVar8.second;
      CVar4 = PVar8.first.unsafe_capptr;
      if (pNVar7 != (Node *)0x0) {
        pNVar7[1].prev = pNVar7 + 1;
        pNVar7[1].next = (Node *)CVar4.unsafe_capptr;
        *(undefined1 *)((long)&pNVar7[2].next + 5) = 1;
        *(undefined2 *)((long)&pNVar7[2].next + 2) = 1;
        pNVar7->next = (alloc->laden).head.next;
        ((alloc->laden).head.next)->prev = pNVar7;
        pNVar7->prev = &(alloc->laden).head;
        (alloc->laden).head.next = pNVar7;
      }
    }
    else {
      piVar3 = __errno_location();
      *piVar3 = 0xc;
      CVar4.unsafe_capptr = (Node *)0x0;
    }
  }
  return CVar4.unsafe_capptr;
}

Assistant:

void* operator new(size_t size, std::align_val_t val)
{
  size = snmalloc::aligned_size(size_t(val), size);
  return snmalloc::libc::malloc(size);
}